

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

void __thiscall
tsbp::TwoStepBranchingProcedure::UpdateSolverStatistics
          (TwoStepBranchingProcedure *this,SolverStatistics *statistics)

{
  long lVar1;
  double dVar2;
  
  statistics->CallCountLMAO = statistics->CallCountLMAO + (this->statistics).CallCountLMAO;
  lVar1 = (this->statistics).NodeCountTSBP;
  statistics->NodeCountLMAO = statistics->NodeCountLMAO + (this->statistics).NodeCountLMAO;
  statistics->NodeCountTSBP = statistics->NodeCountTSBP + lVar1;
  dVar2 = (this->statistics).TimeTSBP;
  statistics->TimeLMAO = statistics->TimeLMAO + (this->statistics).TimeLMAO;
  statistics->TimeTSBP = statistics->TimeTSBP + dVar2;
  statistics->TimeMemoryDeallocation =
       (this->statistics).TimeMemoryDeallocation + statistics->TimeMemoryDeallocation;
  dVar2 = (this->statistics).MemoryUsage;
  if (dVar2 <= statistics->MemoryUsage) {
    dVar2 = statistics->MemoryUsage;
  }
  statistics->MemoryUsage = dVar2;
  return;
}

Assistant:

void TwoStepBranchingProcedure::UpdateSolverStatistics(SolverStatistics& statistics) const
{
    statistics.CallCountLMAO += this->statistics.CallCountLMAO;
    statistics.NodeCountLMAO += this->statistics.NodeCountLMAO;
    statistics.TimeLMAO += this->statistics.TimeLMAO;

    statistics.NodeCountTSBP += this->statistics.NodeCountTSBP;
    statistics.TimeTSBP += this->statistics.TimeTSBP;

    statistics.TimeMemoryDeallocation += this->statistics.TimeMemoryDeallocation;

    statistics.MemoryUsage = std::max<double>(statistics.MemoryUsage, this->statistics.MemoryUsage);
}